

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_31::HttpClientAdapter::ResponseImpl::send
          (ResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  StringPtr **ppSVar1;
  byte bVar2;
  PromiseFulfiller<kj::HttpClient::Response> *pPVar3;
  HttpHeaders *pHVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  ResponseImpl *this_00;
  DelayedEofInputStream *pDVar6;
  byte bVar7;
  void *__child_stack;
  undefined4 in_register_00000034;
  ResponseImpl *pRVar8;
  undefined4 in_register_00000084;
  __fn *in_R9;
  byte *in_stack_00000008;
  Own<kj::HttpHeaders> headersCopy;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> local_148;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream> wrapper;
  Own<kj::_::PromiseNode> local_128;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> local_118;
  OneWayPipe pipe;
  String statusTextCopy;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> local_c8;
  undefined1 local_b8 [40];
  DelayedEofInputStream *pDStack_90;
  HttpHeaders *pHStack_88;
  byte local_80;
  Array<char> *local_78;
  Maybe<unsigned_long> local_50;
  StringPtr statusText_local;
  
  pRVar8 = (ResponseImpl *)CONCAT44(in_register_00000034,__fd);
  statusText_local.content.size_ = CONCAT44(in_register_00000084,__flags);
  statusText_local.content.ptr = (char *)__n;
  str<kj::StringPtr&>(&statusTextCopy,(kj *)&statusText_local,(StringPtr *)__buf);
  HttpHeaders::clone((HttpHeaders *)local_b8,in_R9,__child_stack,(int)__n,
                     (void *)CONCAT44(in_register_00000084,__flags));
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)local_b8);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_b8);
  pHVar4 = headersCopy.ptr;
  bVar2 = *in_stack_00000008;
  bVar7 = bVar2;
  if (*(int *)&(pRVar8->super_Refcounted).field_0xc != 1) {
    aVar5 = local_50.ptr.field_1;
    if (((bVar2 & 1) == 0) ||
       (aVar5.value = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                      (in_stack_00000008 + 8))->value,
       ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(in_stack_00000008 + 8))->
       value != 0)) {
      local_50.ptr.field_1 = aVar5;
      local_50.ptr.isSet = (bool)bVar2;
      newOneWayPipe(&pipe,&local_50);
      ppSVar1 = (StringPtr **)&(pRVar8->super_Refcounted).refcount;
      *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
      local_118.disposer = &(pRVar8->super_Refcounted).super_Disposer;
      local_118.ptr = (ResponseImpl *)0x0;
      local_c8.disposer = local_118.disposer;
      local_c8.ptr = pRVar8;
      heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>
                ((kj *)&local_148,(Own<kj::_::PromiseNode> *)&pRVar8->task,&local_c8);
      local_128.ptr = (PromiseNode *)local_148.ptr;
      local_b8._0_8_ = local_148.disposer;
      local_148.ptr = (DelayedEofInputStream *)0x0;
      local_128.disposer = local_148.disposer;
      local_b8._8_8_ = (StringPtr *)0x0;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_b8);
      Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
      ::~Own((Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
              *)&local_148);
      Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>::~Own(&local_c8);
      heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,kj::Own<kj::AsyncInputStream>,kj::Promise<void>>
                ((kj *)&wrapper,&pipe.in,(Promise<void> *)&local_128);
      Own<kj::_::PromiseNode>::dispose(&local_128);
      Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>::~Own(&local_118);
      pDVar6 = wrapper.ptr;
      pHVar4 = headersCopy.ptr;
      pPVar3 = (pRVar8->fulfiller).ptr;
      local_b8._0_4_ = (int)__buf;
      local_b8._8_8_ = (StringPtr *)0x33812f;
      if (statusTextCopy.content.size_ != 0) {
        local_b8._8_8_ = statusTextCopy.content.ptr;
      }
      local_b8._16_8_ = statusTextCopy.content.size_ + (statusTextCopy.content.size_ == 0);
      local_b8._24_8_ = headersCopy.ptr;
      local_148.disposer = (Disposer *)operator_new(0x40);
      headersCopy.ptr = (HttpHeaders *)0x0;
      (((Header *)local_148.disposer)->name).content.size_ = (size_t)headersCopy.disposer;
      (((Header *)local_148.disposer)->value).content.ptr = (char *)pHVar4;
      (((Header *)local_148.disposer)->value).content.size_ = (size_t)statusTextCopy.content.ptr;
      (((Header *)((long)local_148.disposer + 0x20))->name).content.ptr =
           (char *)statusTextCopy.content.size_;
      (((Header *)((long)local_148.disposer + 0x20))->name).content.size_ =
           (size_t)statusTextCopy.content.disposer;
      statusTextCopy.content.ptr = (char *)0x0;
      statusTextCopy.content.size_ = 0;
      wrapper.ptr = (DelayedEofInputStream *)0x0;
      (((Header *)((long)local_148.disposer + 0x20))->value).content.ptr = (char *)wrapper.disposer;
      (((Header *)((long)local_148.disposer + 0x20))->value).content.size_ = (size_t)pDVar6;
      (((Header *)local_148.disposer)->name).content.ptr = (char *)&PTR_disposeImpl_0042c160;
      pDStack_90 = (DelayedEofInputStream *)0x1;
      if (pDVar6 != (DelayedEofInputStream *)0x0) {
        pDStack_90 = pDVar6;
      }
      local_148.ptr = (DelayedEofInputStream *)0x0;
      local_b8._32_8_ = local_148.disposer;
      (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,local_b8);
      Own<kj::AsyncInputStream>::dispose((Own<kj::AsyncInputStream> *)(local_b8 + 0x20));
      Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>::~Own(&local_148);
      (this->super_Response)._vptr_Response = (_func_int **)pipe.out.disposer;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pipe.out.ptr;
      pipe.out.ptr = (AsyncOutputStream *)0x0;
      Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>::~Own(&wrapper);
      OneWayPipe::~OneWayPipe(&pipe);
      goto LAB_002c2202;
    }
    bVar7 = 1;
  }
  local_b8._8_4_ = (int)__buf;
  local_b8._16_8_ = statusTextCopy.content.ptr;
  local_b8._24_8_ = statusTextCopy.content.size_;
  local_b8._32_8_ = statusTextCopy.content.disposer;
  headersCopy.ptr = (HttpHeaders *)0x0;
  statusTextCopy.content.ptr = (char *)0x0;
  statusTextCopy.content.size_ = 0;
  pDStack_90 = (DelayedEofInputStream *)headersCopy.disposer;
  pHStack_88 = pHVar4;
  if ((bVar7 & 1) != 0) {
    local_78 = *(Array<char> **)(in_stack_00000008 + 8);
  }
  local_b8._0_8_ = pRVar8;
  local_80 = bVar2;
  this_00 = (ResponseImpl *)operator_new(0x70);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)&pRVar8->task,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4311:26),_kj::_::PropagateException>
             ::anon_class_72_5_009bee8d_for_func::operator());
  pHVar4 = pHStack_88;
  ((PromiseNode *)&this_00->super_Response)->_vptr_PromiseNode = (_func_int **)&PTR_onReady_0042bbc8
  ;
  (this_00->fulfiller).ptr = (PromiseFulfiller<kj::HttpClient::Response> *)local_b8._0_8_;
  *(undefined4 *)&(this_00->task).super_PromiseBase.node.disposer = local_b8._8_4_;
  (this_00->task).super_PromiseBase.node.ptr = (PromiseNode *)local_b8._16_8_;
  this_00[1].super_Response._vptr_Response = (_func_int **)local_b8._24_8_;
  local_b8._16_8_ = 0;
  local_b8._24_8_ = (HttpHeaders *)0x0;
  this_00[1].super_Refcounted.super_Disposer._vptr_Disposer = (_func_int **)local_b8._32_8_;
  *(DelayedEofInputStream **)&this_00[1].super_Refcounted.refcount = pDStack_90;
  pHStack_88 = (HttpHeaders *)0x0;
  this_00[1].fulfiller.disposer = (Disposer *)pHVar4;
  *(byte *)&this_00[1].fulfiller.ptr = local_80;
  if (local_80 == 1) {
    this_00[1].task.super_PromiseBase.node.disposer = (Disposer *)local_78;
  }
  pipe.in.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  local_148.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  pipe.in.ptr = (AsyncInputStream *)0x0;
  local_118.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  local_148.ptr = (DelayedEofInputStream *)0x0;
  local_118.ptr = this_00;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_148);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&pipe);
  pDVar6 = (DelayedEofInputStream *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            ((TransformPromiseNodeBase *)pDVar6,(Own<kj::_::PromiseNode> *)&local_118,
             _::IdentityFunc<void>::operator());
  (pDVar6->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_onReady_0042bd38;
  pipe.in.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
        ::instance;
  local_148.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
        ::instance;
  pipe.in.ptr = (AsyncInputStream *)0x0;
  wrapper.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
        ::instance;
  local_148.ptr = (DelayedEofInputStream *)0x0;
  wrapper.ptr = pDVar6;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_148);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&pipe);
  _::spark<kj::_::Void>((_ *)&local_c8,(Own<kj::_::PromiseNode> *)&wrapper);
  local_128.disposer = local_c8.disposer;
  local_128.ptr = (PromiseNode *)local_c8.ptr;
  local_c8.ptr = (ResponseImpl *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_c8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&wrapper);
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&pRVar8->task,&local_128);
  Own<kj::_::PromiseNode>::dispose(&local_128);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_118);
  (anonymous_namespace)::HttpClientAdapter::ResponseImpl::
  send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1}::
  ~Maybe((_lambda___1_ *)local_b8);
  heap<kj::(anonymous_namespace)::NullOutputStream>();
  (this->super_Response)._vptr_Response = (_func_int **)local_b8._0_8_;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_b8._8_8_;
  local_b8._8_8_ = (StringPtr *)0x0;
  Own<kj::(anonymous_namespace)::NullOutputStream>::~Own
            ((Own<kj::(anonymous_namespace)::NullOutputStream> *)local_b8);
LAB_002c2202:
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
  }
  Array<char>::~Array(&statusTextCopy.content);
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (method == kj::HttpMethod::HEAD || expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::heap<NullInputStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<NullOutputStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        auto wrapper = kj::heap<DelayedEofInputStream>(
            kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }